

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileUtil.cpp
# Opt level: O3

void __thiscall AppendFile::append(AppendFile *this,char *logline,size_t len)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  
  sVar2 = fwrite_unlocked(logline,1,len,(FILE *)this->fp_);
  while( true ) {
    if (sVar2 == len) {
      return;
    }
    sVar3 = fwrite_unlocked(logline + sVar2,1,len - sVar2,(FILE *)this->fp_);
    if (sVar3 == 0) break;
    sVar2 = sVar2 + sVar3;
  }
  iVar1 = ferror((FILE *)this->fp_);
  if (iVar1 == 0) {
    return;
  }
  append();
  return;
}

Assistant:

void AppendFile::append(const char* logline, const size_t len) {
  size_t n = this->write(logline, len);
  size_t remain = len - n;
  while (remain > 0) {
    size_t x = this->write(logline + n, remain);
    if (x == 0) {
      int err = ferror(fp_);
      if (err) fprintf(stderr, "AppendFile::append() failed !\n");
      break;
    }
    n += x;
    remain = len - n;
  }
}